

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O1

void ast::Sections::binary_logisim
               (char *file_name,uint word_size,uint byte_order,uint lower_address,
               uint higher_address)

{
  byte bVar1;
  byte bVar2;
  uint32_t address;
  uint uVar3;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,file_name,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"v2.0 raw",8);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  address = lower_address + byte_order;
  do {
    while( true ) {
      if (higher_address <= address) {
        std::ofstream::close();
        local_230 = _VTT;
        *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
        std::filebuf::~filebuf(local_228);
        std::ios_base::~ios_base(local_138);
        return;
      }
      bVar1 = Memory_space::read8((Memory_space *)memory,address);
      address = address + word_size;
      bVar2 = Memory_space::read8((Memory_space *)memory,address);
      if (bVar2 == bVar1) break;
      ostream_printf((ostream *)&local_230," %02x",(ulong)(uint)bVar1);
    }
    uVar3 = 2;
    while (address = address + word_size, address < higher_address) {
      bVar2 = Memory_space::read8((Memory_space *)memory,address);
      if (bVar1 != bVar2) break;
      uVar3 = uVar3 + 1;
    }
    ostream_printf((ostream *)&local_230," %d*%02x",(ulong)uVar3,(ulong)(uint)bVar1);
  } while( true );
}

Assistant:

void Sections::binary_logisim(const char *file_name,
								unsigned word_size, unsigned byte_order,
								unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		file << "v2.0 raw" << endl;
		for (auto address = lower_address + byte_order; address < higher_address; ) {
			uint8_t c = memory.read8(address);
			address += word_size;
			//	Quantos bytes iguais a este?
			if (memory.read8(address) == c) {
				auto j = 2U;
				for (address += word_size;
				     	address < higher_address && c == memory.read8(address);
					 		address += word_size, j++)
					;
				ostream_printf(file, " %d*%02x", j, static_cast<uint8_t >(c));
			}
			else
				ostream_printf(file, " %02x", static_cast<uint8_t >(c));
		}
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}